

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

bool __thiscall Confparse::WriteStr(Confparse *this,char *key,char *value)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  _Ios_Openmode __mode;
  size_t sVar5;
  char *in_RDX;
  char *in_RSI;
  path *in_RDI;
  ofstream file_2;
  char sep [10240];
  ofstream file_1;
  path nfn_1;
  char *ep;
  ofstream file;
  path nfn;
  size_t bs;
  char buf [1024];
  int keylen;
  char *llimit;
  char *op;
  char *p;
  undefined4 in_stack_ffffffffffffccc0;
  openmode in_stack_ffffffffffffccc4;
  path *in_stack_ffffffffffffccc8;
  undefined4 in_stack_ffffffffffffccd0;
  undefined4 in_stack_ffffffffffffccd4;
  char local_32c8 [512];
  char local_30c8 [599];
  undefined1 in_stack_ffffffffffffd18f;
  path *in_stack_ffffffffffffd190;
  Confparse *in_stack_ffffffffffffd198;
  char local_8c0 [512];
  path local_6c0;
  char *local_698;
  undefined4 local_68c;
  char local_688 [528];
  path local_478;
  long local_450;
  char local_448 [1036];
  int local_3c;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  byte local_1;
  
  if (*(long *)&in_RDI[0x101]._M_pathname == 0) {
    local_1 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    bVar1 = std::filesystem::__cxx11::path::empty((path *)0x11083d);
    if (bVar1) {
      local_1 = 0;
    }
    else if (local_20 == (char *)0x0) {
      local_1 = 0;
    }
    else if (local_18 == (char *)0x0) {
      local_1 = 0;
    }
    else {
      sVar5 = strlen(local_18);
      local_3c = (int)sVar5;
      if (local_3c == 0) {
        local_1 = 0;
      }
      else {
        local_30 = strstr(*(char **)&in_RDI[0x101]._M_pathname,local_18);
        local_28 = local_30;
        if (local_30 == (char *)0x0) {
          std::filesystem::__cxx11::path::path
                    ((path *)CONCAT44(in_stack_ffffffffffffccd4,in_stack_ffffffffffffccd0),
                     in_stack_ffffffffffffccc8);
          std::filesystem::__cxx11::path::operator+=
                    ((path *)CONCAT44(in_stack_ffffffffffffccd4,in_stack_ffffffffffffccd0),
                     (value_type_conflict *)in_stack_ffffffffffffccc8);
          std::ofstream::ofstream(local_688);
          std::filesystem::rename(in_RDI,&local_478);
          _Var3 = std::operator|(_S_out,_S_bin);
          std::operator|(_Var3,_S_trunc);
          std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                    ((basic_ofstream<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_ffffffffffffccd4,in_stack_ffffffffffffccd0),
                     in_stack_ffffffffffffccc8,in_stack_ffffffffffffccc4);
          bVar2 = std::ofstream::is_open();
          local_1 = (bVar2 & 1) != 0;
          if ((bool)local_1) {
            std::ostream::write(local_688,*(long *)&in_RDI[0x101]._M_pathname);
            iVar4 = snprintf(local_448,0x400,"\r\n%s = %s",local_18,local_20);
            local_450 = (long)iVar4;
            std::ostream::write(local_688,(long)local_448);
            std::ostream::flush();
            std::ofstream::close();
            Load(in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,(bool)in_stack_ffffffffffffd18f
                );
          }
          local_68c = 1;
          std::ofstream::~ofstream(local_688);
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_ffffffffffffccc4,in_stack_ffffffffffffccc0));
        }
        else {
          local_38 = (char *)in_RDI[0x101]._M_pathname._M_string_length;
          while (local_30 = local_28, local_28 != (char *)0x0 && local_28 < local_38) {
            local_28 = local_28 + local_3c;
            if ((local_28 < local_38) && (iVar4 = isalnum((int)*local_28), iVar4 == 0)) {
              while( true ) {
                bVar1 = false;
                if ((local_28 < local_38) &&
                   ((bVar1 = true, *local_28 != '=' && (bVar1 = true, *local_28 != ' ')))) {
                  bVar1 = *local_28 == '\t';
                }
                if (!bVar1) break;
                local_28 = local_28 + 1;
              }
              if (((local_28 < local_38) && (*(char **)&in_RDI[0x101]._M_pathname <= local_28)) &&
                 ((local_30 == *(char **)&in_RDI[0x101]._M_pathname ||
                  ((local_30[-1] == '\r' || (local_30[-1] == '\n')))))) {
                local_698 = local_28;
                while( true ) {
                  bVar1 = false;
                  if (((local_698 < (char *)in_RDI[0x101]._M_pathname._M_string_length) &&
                      (bVar1 = false, *local_698 != '\0')) && (bVar1 = false, *local_698 != '\n')) {
                    bVar1 = *local_698 != '\r';
                  }
                  if (!bVar1) break;
                  local_698 = local_698 + 1;
                }
                std::filesystem::__cxx11::path::path
                          ((path *)CONCAT44(in_stack_ffffffffffffccd4,in_stack_ffffffffffffccd0),
                           in_stack_ffffffffffffccc8);
                std::filesystem::__cxx11::path::operator+=
                          ((path *)CONCAT44(in_stack_ffffffffffffccd4,in_stack_ffffffffffffccd0),
                           (value_type_conflict *)in_stack_ffffffffffffccc8);
                std::ofstream::ofstream(local_8c0);
                std::filesystem::rename(in_RDI,&local_6c0);
                _Var3 = std::operator|(_S_out,_S_bin);
                std::operator|(_Var3,_S_trunc);
                std::basic_ofstream<char,_std::char_traits<char>_>::
                open<std::filesystem::__cxx11::path>
                          ((basic_ofstream<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_ffffffffffffccd4,in_stack_ffffffffffffccd0),
                           in_stack_ffffffffffffccc8,in_stack_ffffffffffffccc4);
                bVar2 = std::ofstream::is_open();
                local_1 = (bVar2 & 1) != 0;
                if ((bool)local_1) {
                  std::ostream::write(local_8c0,*(long *)&in_RDI[0x101]._M_pathname);
                  strlen(local_20);
                  std::ostream::write(local_8c0,(long)local_20);
                  std::ostream::write(local_8c0,(long)local_698);
                  std::ofstream::close();
                  Load(in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                       (bool)in_stack_ffffffffffffd18f);
                }
                local_68c = 1;
                std::ofstream::~ofstream(local_8c0);
                std::filesystem::__cxx11::path::~path
                          ((path *)CONCAT44(in_stack_ffffffffffffccc4,in_stack_ffffffffffffccc0));
                goto LAB_00111072;
              }
            }
            local_28 = strstr(local_30 + 1,local_18);
          }
          std::ofstream::ofstream(local_32c8);
          _Var3 = std::operator|(_S_out,_S_bin);
          __mode = std::operator|(_Var3,_S_app);
          std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                    ((basic_ofstream<char,_std::char_traits<char>_> *)
                     CONCAT44(_Var3,in_stack_ffffffffffffccd0),in_RDI,__mode);
          bVar2 = std::ofstream::is_open();
          local_1 = (bVar2 & 1) != 0;
          if ((bool)local_1) {
            snprintf(local_30c8,0x2800,"%s = %s\r\n",local_18,local_20);
            strlen(local_30c8);
            std::ostream::write(local_32c8,(long)local_30c8);
            std::ostream::flush();
            std::ofstream::close();
            Load(in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,(bool)in_stack_ffffffffffffd18f
                );
          }
          local_68c = 1;
          std::ofstream::~ofstream(local_32c8);
        }
      }
    }
  }
LAB_00111072:
  return (bool)(local_1 & 1);
}

Assistant:

bool Confparse::WriteStr(const char *key, const char *value) {
	char *p, *op;
	char *llimit;
	int keylen;

	if (!conf) return false;
	if (filepath.empty()) return false;
	if (!value) return false;
	if (!key) return false;

	keylen = strlen(key);
	if (keylen == 0) return false;
	op = p = strstr(conf, key);
	if (p == NULL) {
		char buf[1024];
		size_t bs;
		auto nfn = filepath;
		nfn += "~";
		ofstream file;

		filesystem::rename(filepath, nfn);
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
		if (!file.is_open()) {
			return false;
		}
		file.write(conf, buffer_size); // write the leadup
		bs = snprintf(buf, sizeof(buf), "\r\n%s = %s", key, value);
		file.write(buf, bs);
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	//	llimit = limit - keylen - 2; // allows for up to 'key=x'
	llimit = limit;
	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;
		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) {
				p++; // get up to the start of the value;
			}

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					char *ep = NULL;

					/*
					 * op represents the start of the line/key.
					 * p represents the start of the value.
					 *
					 * we can just dump out to the file up to p and then
					 * print our data
					 */

					/*
					 * Search for the end of the data by finding the end of the line
					 * This will become 'ep', which we'll use as the start of the
					 * rest of the file data we dump back to the config.
					 */
					ep = p;
					while ((ep < limit) && ((*ep != '\0') && (*ep != '\n') && (*ep != '\r'))) {
						ep++;
					}

					{
						auto nfn = filepath;
						nfn += "~";
						ofstream file;

						filesystem::rename(filepath, nfn);
						file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
						if (!file.is_open()) {
							return false;
						}
						file.write(conf, (p - conf));     // write the leadup
						file.write(value, strlen(value)); // write the new data
						file.write(ep, limit - ep);       // write the rest of the file
						file.close();

						Load(filepath);
						return true;
					}
				}
			}
		}
		p  = strstr(op + 1, key);
		op = p;
	}

	/*
	 * If we didn't find our parameter in the config file, then add it.
	 */
	{
		char sep[CONFPARSE_MAX_VALUE_SIZE];
		ofstream file;
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::app);
		if (!file.is_open()) {
			return false;
		}
		snprintf(sep, sizeof(sep), "%s = %s\r\n", key, value);
		file.write(sep, strlen(sep));
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	return false;
}